

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

Vector<double,_3U> * OpenMD::operator*(Vector<double,_3U> *v,RectMatrix<double,_3U,_3U> *m)

{
  double dVar1;
  double *pdVar2;
  RectMatrix<double,_3U,_3U> *in_RDX;
  Vector<double,_3U> *in_RSI;
  Vector<double,_3U> *in_RDI;
  double dVar3;
  uint j;
  uint i;
  Vector<double,_3U> *result;
  undefined4 local_20;
  undefined4 local_1c;
  
  Vector<double,_3U>::Vector(in_RDI);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      pdVar2 = Vector<double,_3U>::operator[](in_RSI,local_20);
      dVar1 = *pdVar2;
      dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_20,local_1c);
      pdVar2 = Vector<double,_3U>::operator[](in_RDI,local_1c);
      *pdVar2 = dVar1 * dVar3 + *pdVar2;
    }
  }
  return in_RDI;
}

Assistant:

inline Vector<Real, Col> operator*(const Vector<Real, Row>& v,
                                     const RectMatrix<Real, Row, Col>& m) {
    Vector<Real, Row> result;

    for (unsigned int i = 0; i < Col; i++)
      for (unsigned int j = 0; j < Row; j++)
        result[i] += v[j] * m(j, i);

    return result;
  }